

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry *in_RDI;
  RowSetEntry *aBucket [40];
  RowSetEntry *pNext;
  uint i;
  RowSetEntry *local_160;
  RowSetEntry *local_158 [40];
  RowSetEntry *local_18;
  uint local_c;
  RowSetEntry *local_8;
  
  local_8 = in_RDI;
  memset(local_158,0,0x140);
  while (local_8 != (RowSetEntry *)0x0) {
    local_18 = local_8->pRight;
    local_8->pRight = (RowSetEntry *)0x0;
    for (local_c = 0; local_158[local_c] != (RowSetEntry *)0x0; local_c = local_c + 1) {
      local_8 = rowSetEntryMerge(local_158[local_c],local_8);
      local_158[local_c] = (RowSetEntry *)0x0;
    }
    local_158[local_c] = local_8;
    local_8 = local_18;
  }
  local_8 = local_158[0];
  for (local_c = 1; local_c < 0x28; local_c = local_c + 1) {
    if (local_158[local_c] != (RowSetEntry *)0x0) {
      if (local_8 == (RowSetEntry *)0x0) {
        local_160 = local_158[local_c];
      }
      else {
        local_160 = rowSetEntryMerge(local_8,local_158[local_c]);
      }
      local_8 = local_160;
    }
  }
  return local_8;
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = aBucket[0];
  for(i=1; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    if( aBucket[i]==0 ) continue;
    pIn = pIn ? rowSetEntryMerge(pIn, aBucket[i]) : aBucket[i];
  }
  return pIn;
}